

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  LogMessage *pLVar6;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<float> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<bool> *this_05;
  RepeatedField<int> *pRVar7;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_06;
  RepeatedPtrField<google::protobuf::MessageLite> *this_07;
  undefined4 extraout_var;
  int64 iVar8;
  undefined8 uVar9;
  long *plVar10;
  LogFinisher local_1fa;
  byte local_1f9;
  LogMessage local_1f8;
  LogFinisher local_1ba;
  byte local_1b9;
  LogMessage local_1b8;
  LogFinisher local_17a;
  byte local_179;
  LogMessage local_178;
  undefined1 local_139;
  Extension *pEStack_138;
  bool is_new_1;
  Extension *extension_1;
  MessageLite *target;
  MessageLite *other_message;
  RepeatedPtrField<google::protobuf::MessageLite> *pRStack_118;
  int i;
  RepeatedPtrField<google::protobuf::MessageLite> *other_repeated_message;
  LogMessage local_108;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  byte local_39;
  Extension *pEStack_38;
  bool is_new;
  Extension *extension;
  Extension *other_extension;
  _Self local_20;
  const_iterator iter;
  ExtensionSet *other_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)other;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::begin(&other->extensions_);
  while( true ) {
    other_extension =
         (Extension *)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                *)iter._M_node);
    bVar1 = std::operator!=(&local_20,(_Self *)&other_extension);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_20);
    extension = &ppVar5->second;
    if (((ppVar5->second).is_repeated & 1U) == 0) {
      if (((ppVar5->second).field_0xa & 1) == 0) {
        CVar2 = anon_unknown_0::cpp_type((ppVar5->second).type);
        switch(CVar2) {
        case CPPTYPE_INT32:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetInt32(this,ppVar5->first,extension->type,(extension->field_0).int32_value,
                   extension->descriptor);
          break;
        case CPPTYPE_INT64:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetInt64(this,ppVar5->first,extension->type,(extension->field_0).int64_value,
                   extension->descriptor);
          break;
        case CPPTYPE_UINT32:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetUInt32(this,ppVar5->first,extension->type,(extension->field_0).uint32_value,
                    extension->descriptor);
          break;
        case CPPTYPE_UINT64:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetUInt64(this,ppVar5->first,extension->type,(extension->field_0).uint64_value,
                    extension->descriptor);
          break;
        case CPPTYPE_DOUBLE:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetDouble(this,ppVar5->first,extension->type,(extension->field_0).double_value,
                    extension->descriptor);
          break;
        case CPPTYPE_FLOAT:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetFloat(this,ppVar5->first,extension->type,(extension->field_0).float_value,
                   extension->descriptor);
          break;
        case CPPTYPE_BOOL:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetBool(this,ppVar5->first,extension->type,(bool)((extension->field_0).bool_value & 1),
                  extension->descriptor);
          break;
        case CPPTYPE_ENUM:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetEnum(this,ppVar5->first,extension->type,(extension->field_0).enum_value,
                  extension->descriptor);
          break;
        case CPPTYPE_STRING:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          SetString(this,ppVar5->first,extension->type,(extension->field_0).string_value,
                    extension->descriptor);
          break;
        case CPPTYPE_MESSAGE:
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                   ::operator->(&local_20);
          local_139 = MaybeNewExtension(this,ppVar5->first,extension->descriptor,
                                        &stack0xfffffffffffffec8);
          if ((bool)local_139) {
            pEStack_138->type = extension->type;
            pEStack_138->is_packed = (bool)(extension->is_packed & 1);
            pEStack_138->is_repeated = false;
            if (((byte)extension->field_0xa >> 4 & 1) == 0) {
              pEStack_138->field_0xa = pEStack_138->field_0xa & 0xf;
              iVar8 = (**(code **)(((extension->field_0).repeated_int32_value)->elements_ + 6))();
              (pEStack_138->field_0).int64_value = iVar8;
              (**(code **)(((pEStack_138->field_0).repeated_int32_value)->elements_ + 0xe))
                        ((pEStack_138->field_0).repeated_int32_value,
                         (extension->field_0).int64_value);
            }
            else {
              pEStack_138->field_0xa = pEStack_138->field_0xa & 0xf | 0x10;
              iVar8 = (**(code **)(((extension->field_0).repeated_int32_value)->elements_ + 4))();
              (pEStack_138->field_0).int64_value = iVar8;
              (**(code **)(((pEStack_138->field_0).repeated_int32_value)->elements_ + 0x14))
                        ((pEStack_138->field_0).repeated_int32_value,
                         (extension->field_0).int64_value);
            }
          }
          else {
            local_179 = 0;
            if (pEStack_138->type != extension->type) {
              LogMessage::LogMessage
                        (&local_178,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                         ,0x319);
              local_179 = 1;
              pLVar6 = LogMessage::operator<<
                                 (&local_178,
                                  "CHECK failed: (extension->type) == (other_extension.type): ");
              LogFinisher::operator=(&local_17a,pLVar6);
            }
            if ((local_179 & 1) != 0) {
              LogMessage::~LogMessage(&local_178);
            }
            local_1b9 = 0;
            if ((pEStack_138->is_packed & 1U) != (extension->is_packed & 1U)) {
              LogMessage::LogMessage
                        (&local_1b8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                         ,0x31a);
              local_1b9 = 1;
              pLVar6 = LogMessage::operator<<
                                 (&local_1b8,
                                  "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                                 );
              LogFinisher::operator=(&local_1ba,pLVar6);
            }
            if ((local_1b9 & 1) != 0) {
              LogMessage::~LogMessage(&local_1b8);
            }
            local_1f9 = 0;
            if ((pEStack_138->is_repeated & 1U) != 0) {
              LogMessage::LogMessage
                        (&local_1f8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                         ,0x31b);
              local_1f9 = 1;
              pLVar6 = LogMessage::operator<<(&local_1f8,"CHECK failed: !extension->is_repeated: ");
              LogFinisher::operator=(&local_1fa,pLVar6);
            }
            if ((local_1f9 & 1) != 0) {
              LogMessage::~LogMessage(&local_1f8);
            }
            if (((byte)extension->field_0xa >> 4 & 1) == 0) {
              if (((byte)pEStack_138->field_0xa >> 4 & 1) == 0) {
                (**(code **)(((pEStack_138->field_0).repeated_int32_value)->elements_ + 0xe))
                          ((pEStack_138->field_0).repeated_int32_value,
                           (extension->field_0).int64_value);
              }
              else {
                plVar10 = (long *)(**(code **)(((pEStack_138->field_0).repeated_int32_value)->
                                               elements_ + 8))
                                            ((pEStack_138->field_0).repeated_int32_value,
                                             (extension->field_0).int64_value);
                (**(code **)(*plVar10 + 0x38))(plVar10,(extension->field_0).int64_value);
              }
            }
            else if (((byte)pEStack_138->field_0xa >> 4 & 1) == 0) {
              pRVar7 = (pEStack_138->field_0).repeated_int32_value;
              uVar9 = (**(code **)(((extension->field_0).repeated_int32_value)->elements_ + 6))
                                ((extension->field_0).repeated_int32_value,
                                 (pEStack_138->field_0).int64_value);
              (**(code **)(pRVar7->elements_ + 0xe))(pRVar7,uVar9);
            }
            else {
              (**(code **)(((pEStack_138->field_0).repeated_int32_value)->elements_ + 0x14))
                        ((pEStack_138->field_0).repeated_int32_value,
                         (extension->field_0).int64_value);
            }
          }
          pEStack_138->field_0xa = pEStack_138->field_0xa & 0xf0;
        }
      }
    }
    else {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_20);
      local_39 = MaybeNewExtension(this,ppVar5->first,extension->descriptor,&stack0xffffffffffffffc8
                                  );
      if ((bool)local_39) {
        pEStack_38->type = extension->type;
        pEStack_38->is_packed = (bool)(extension->is_packed & 1);
        pEStack_38->is_repeated = true;
      }
      else {
        local_79 = 0;
        if (pEStack_38->type != extension->type) {
          LogMessage::LogMessage
                    (&local_78,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x2ba);
          local_79 = 1;
          pLVar6 = LogMessage::operator<<
                             (&local_78,
                              "CHECK failed: (extension->type) == (other_extension.type): ");
          LogFinisher::operator=(local_8d,pLVar6);
        }
        if ((local_79 & 1) != 0) {
          LogMessage::~LogMessage(&local_78);
        }
        local_c9 = 0;
        if ((pEStack_38->is_packed & 1U) != (extension->is_packed & 1U)) {
          LogMessage::LogMessage
                    (&local_c8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,699);
          local_c9 = 1;
          pLVar6 = LogMessage::operator<<
                             (&local_c8,
                              "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                             );
          LogFinisher::operator=(&local_ca,pLVar6);
        }
        if ((local_c9 & 1) != 0) {
          LogMessage::~LogMessage(&local_c8);
        }
        other_repeated_message._7_1_ = 0;
        if ((pEStack_38->is_repeated & 1U) == 0) {
          LogMessage::LogMessage
                    (&local_108,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,700);
          other_repeated_message._7_1_ = 1;
          pLVar6 = LogMessage::operator<<(&local_108,"CHECK failed: extension->is_repeated: ");
          LogFinisher::operator=((LogFinisher *)((long)&other_repeated_message + 6),pLVar6);
        }
        if ((other_repeated_message._7_1_ & 1) != 0) {
          LogMessage::~LogMessage(&local_108);
        }
      }
      CVar2 = anon_unknown_0::cpp_type(extension->type);
      switch(CVar2) {
      case CPPTYPE_INT32:
        if ((local_39 & 1) != 0) {
          pRVar7 = (RepeatedField<int> *)operator_new(0x10);
          RepeatedField<int>::RepeatedField(pRVar7);
          (pEStack_38->field_0).repeated_int32_value = pRVar7;
        }
        RepeatedField<int>::MergeFrom
                  ((pEStack_38->field_0).repeated_int32_value,
                   (extension->field_0).repeated_int32_value);
        break;
      case CPPTYPE_INT64:
        if ((local_39 & 1) != 0) {
          this_00 = (RepeatedField<long> *)operator_new(0x10);
          RepeatedField<long>::RepeatedField(this_00);
          (pEStack_38->field_0).repeated_int64_value = this_00;
        }
        RepeatedField<long>::MergeFrom
                  ((pEStack_38->field_0).repeated_int64_value,
                   (extension->field_0).repeated_int64_value);
        break;
      case CPPTYPE_UINT32:
        if ((local_39 & 1) != 0) {
          this_01 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          RepeatedField<unsigned_int>::RepeatedField(this_01);
          (pEStack_38->field_0).repeated_uint32_value = this_01;
        }
        RepeatedField<unsigned_int>::MergeFrom
                  ((pEStack_38->field_0).repeated_uint32_value,
                   (extension->field_0).repeated_uint32_value);
        break;
      case CPPTYPE_UINT64:
        if ((local_39 & 1) != 0) {
          this_02 = (RepeatedField<unsigned_long> *)operator_new(0x10);
          RepeatedField<unsigned_long>::RepeatedField(this_02);
          (pEStack_38->field_0).repeated_uint64_value = this_02;
        }
        RepeatedField<unsigned_long>::MergeFrom
                  ((pEStack_38->field_0).repeated_uint64_value,
                   (extension->field_0).repeated_uint64_value);
        break;
      case CPPTYPE_DOUBLE:
        if ((local_39 & 1) != 0) {
          this_04 = (RepeatedField<double> *)operator_new(0x10);
          RepeatedField<double>::RepeatedField(this_04);
          (pEStack_38->field_0).repeated_double_value = this_04;
        }
        RepeatedField<double>::MergeFrom
                  ((pEStack_38->field_0).repeated_double_value,
                   (extension->field_0).repeated_double_value);
        break;
      case CPPTYPE_FLOAT:
        if ((local_39 & 1) != 0) {
          this_03 = (RepeatedField<float> *)operator_new(0x10);
          RepeatedField<float>::RepeatedField(this_03);
          (pEStack_38->field_0).repeated_float_value = this_03;
        }
        RepeatedField<float>::MergeFrom
                  ((pEStack_38->field_0).repeated_float_value,
                   (extension->field_0).repeated_float_value);
        break;
      case CPPTYPE_BOOL:
        if ((local_39 & 1) != 0) {
          this_05 = (RepeatedField<bool> *)operator_new(0x10);
          RepeatedField<bool>::RepeatedField(this_05);
          (pEStack_38->field_0).repeated_bool_value = this_05;
        }
        RepeatedField<bool>::MergeFrom
                  ((pEStack_38->field_0).repeated_bool_value,
                   (extension->field_0).repeated_bool_value);
        break;
      case CPPTYPE_ENUM:
        if ((local_39 & 1) != 0) {
          pRVar7 = (RepeatedField<int> *)operator_new(0x10);
          RepeatedField<int>::RepeatedField(pRVar7);
          (pEStack_38->field_0).repeated_int32_value = pRVar7;
        }
        RepeatedField<int>::MergeFrom
                  ((pEStack_38->field_0).repeated_int32_value,
                   (extension->field_0).repeated_int32_value);
        break;
      case CPPTYPE_STRING:
        if ((local_39 & 1) != 0) {
          this_06 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)operator_new(0x18);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::RepeatedPtrField(this_06);
          (pEStack_38->field_0).repeated_string_value = this_06;
        }
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::MergeFrom((pEStack_38->field_0).repeated_string_value,
                    (extension->field_0).repeated_string_value);
        break;
      case CPPTYPE_MESSAGE:
        if ((local_39 & 1) != 0) {
          this_07 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
          RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField(this_07);
          (pEStack_38->field_0).repeated_message_value = this_07;
        }
        pRStack_118 = (extension->field_0).repeated_message_value;
        for (other_message._4_4_ = 0; iVar4 = other_message._4_4_,
            iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size(pRStack_118),
            iVar4 < iVar3; other_message._4_4_ = other_message._4_4_ + 1) {
          target = RepeatedPtrField<google::protobuf::MessageLite>::Get
                             (pRStack_118,other_message._4_4_);
          extension_1 = (Extension *)
                        RepeatedPtrFieldBase::
                        AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                                  ((RepeatedPtrFieldBase *)(pEStack_38->field_0).string_value);
          if (extension_1 == (Extension *)0x0) {
            iVar4 = (*target->_vptr_MessageLite[3])();
            extension_1 = (Extension *)CONCAT44(extraout_var,iVar4);
            RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
                      ((pEStack_38->field_0).repeated_message_value,(MessageLite *)extension_1);
          }
          (**(code **)((extension_1->field_0).int64_value + 0x38))(extension_1,target);
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  for (map<int, Extension>::const_iterator iter = other.extensions_.begin();
       iter != other.extensions_.end(); ++iter) {
    const Extension& other_extension = iter->second;

    if (other_extension.is_repeated) {
      Extension* extension;
      bool is_new = MaybeNewExtension(iter->first, other_extension.descriptor,
                                      &extension);
      if (is_new) {
        // Extension did not already exist in set.
        extension->type = other_extension.type;
        extension->is_packed = other_extension.is_packed;
        extension->is_repeated = true;
      } else {
        GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
        GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
        GOOGLE_DCHECK(extension->is_repeated);
      }

      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)             \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
          if (is_new) {                                              \
            extension->repeated_##LOWERCASE##_value =                \
              new REPEATED_TYPE;                                     \
          }                                                          \
          extension->repeated_##LOWERCASE##_value->MergeFrom(        \
            *other_extension.repeated_##LOWERCASE##_value);          \
          break;

        HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
        HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
        HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
        HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
        HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
        HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
        HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
        HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
        HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_new) {
            extension->repeated_message_value =
              new RepeatedPtrField<MessageLite>();
          }
          // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
          // it would attempt to allocate new objects.
          RepeatedPtrField<MessageLite>* other_repeated_message =
              other_extension.repeated_message_value;
          for (int i = 0; i < other_repeated_message->size(); i++) {
            const MessageLite& other_message = other_repeated_message->Get(i);
            MessageLite* target = extension->repeated_message_value
                     ->AddFromCleared<GenericTypeHandler<MessageLite> >();
            if (target == NULL) {
              target = other_message.New();
              extension->repeated_message_value->AddAllocated(target);
            }
            target->CheckTypeAndMergeFrom(other_message);
          }
          break;
      }
    } else {
      if (!other_extension.is_cleared) {
        switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                         \
          case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
            Set##CAMELCASE(iter->first, other_extension.type,                \
                           other_extension.LOWERCASE##_value,                \
                           other_extension.descriptor);                      \
            break;

          HANDLE_TYPE( INT32,  int32,  Int32);
          HANDLE_TYPE( INT64,  int64,  Int64);
          HANDLE_TYPE(UINT32, uint32, UInt32);
          HANDLE_TYPE(UINT64, uint64, UInt64);
          HANDLE_TYPE( FLOAT,  float,  Float);
          HANDLE_TYPE(DOUBLE, double, Double);
          HANDLE_TYPE(  BOOL,   bool,   Bool);
          HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
          case WireFormatLite::CPPTYPE_STRING:
            SetString(iter->first, other_extension.type,
                      *other_extension.string_value,
                      other_extension.descriptor);
            break;
          case WireFormatLite::CPPTYPE_MESSAGE: {
            Extension* extension;
            bool is_new = MaybeNewExtension(iter->first,
                                            other_extension.descriptor,
                                            &extension);
            if (is_new) {
              extension->type = other_extension.type;
              extension->is_packed = other_extension.is_packed;
              extension->is_repeated = false;
              if (other_extension.is_lazy) {
                extension->is_lazy = true;
                extension->lazymessage_value =
                    other_extension.lazymessage_value->New();
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->is_lazy = false;
                extension->message_value =
                    other_extension.message_value->New();
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            } else {
              GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
              GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
              GOOGLE_DCHECK(!extension->is_repeated);
              if (other_extension.is_lazy) {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MergeFrom(
                      *other_extension.lazymessage_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      other_extension.lazymessage_value->GetMessage(
                          *extension->message_value));
                }
              } else {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MutableMessage(
                      *other_extension.message_value)->CheckTypeAndMergeFrom(
                          *other_extension.message_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      *other_extension.message_value);
                }
              }
            }
            extension->is_cleared = false;
            break;
          }
        }
      }
    }
  }
}